

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

int RookMobility(Situation *s)

{
  byte bVar1;
  UINT8 *pUVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  int local_20 [2];
  int rook_mobility [2];
  
  local_20[0] = 0;
  local_20[1] = 0;
  pUVar2 = s->current_pieces + 0x17;
  lVar3 = 0;
  do {
    lVar8 = 0;
    do {
      bVar1 = pUVar2[lVar8];
      if (bVar1 != 0) {
        uVar6 = (ulong)((bVar1 & 0xf) << 0xc);
        uVar7 = (uint)*(byte *)(uVar6 + 0x305d50 + (ulong)s->bit_row[bVar1 >> 4] * 8) -
                (uint)*(byte *)(uVar6 + 0x305d51 + (ulong)s->bit_row[bVar1 >> 4] * 8);
        uVar4 = -uVar7;
        if (0 < (int)uVar7) {
          uVar4 = uVar7;
        }
        iVar5 = (uVar4 & 0xff) + local_20[lVar3];
        local_20[lVar3] = iVar5;
        lVar9 = (ulong)(bVar1 >> 4) * 0x2000;
        uVar7 = (uint)*(byte *)(lVar9 + 0x30bd50 + (ulong)s->bit_col[bVar1 & 0xf] * 8) -
                (uint)*(byte *)(lVar9 + 0x30bd51 + (ulong)s->bit_col[bVar1 & 0xf] * 8);
        uVar4 = -uVar7;
        if (0 < (int)uVar7) {
          uVar4 = uVar7;
        }
        local_20[lVar3] = (uVar4 & 0xff) + iVar5;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 2);
    pUVar2 = pUVar2 + 0x10;
    bVar10 = lVar3 == 0;
    lVar3 = lVar3 + 1;
  } while (bVar10);
  iVar5 = -(local_20[0] - local_20[1]);
  if (s->current_player == 0) {
    iVar5 = local_20[0] - local_20[1];
  }
  return iVar5;
}

Assistant:

int RookMobility(Situation &s)
{
    int SideTag;
    int rook_mobility[2] = {0};
    for (int r = 0; r < 2; r++)
    {
        SideTag = 16 + (r << 4);
        for (int i = 7; i <= 8; i++)
        {
            if (s.current_pieces[SideTag + i] != 0)
            {
                int piece_from = s.current_pieces[SideTag + i];
                int col = GetCol(piece_from), row = GetRow(piece_from);

                int get_col_1 = ROOK_CANNON_CAN_GET_ROW[col - 3][s.bit_row[row]].no_capture[0]; //右方向
                int get_col_2 = ROOK_CANNON_CAN_GET_ROW[col - 3][s.bit_row[row]].no_capture[1]; //左方向
                rook_mobility[r] += abs(get_col_1 - get_col_2);

                int get_row_1 = ROOK_CANNON_CAN_GET_COL[row - 3][s.bit_col[col]].no_capture[0]; //下方向
                int get_row_2 = ROOK_CANNON_CAN_GET_COL[row - 3][s.bit_col[col]].no_capture[1]; //上方向
                rook_mobility[r] += abs(get_row_1 - get_row_2);
            }
        }
    }

    return SideValue(s.current_player, rook_mobility[RED] - rook_mobility[BLACK]);
}